

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_pgroup_duplicate(Integer grp)

{
  proc_list_t *ppVar1;
  size_t __n;
  int iVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  int iVar6;
  proc_list_t *ppVar7;
  Integer IVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if ((grp != -1) && (PGRP_LIST[grp].actv == 0)) {
    pnga_error(" Group is not active ",grp);
  }
  piVar9 = &PGRP_LIST->actv;
  uVar11 = 0xffffffffffffffff;
  do {
    iVar2 = *piVar9;
    uVar12 = uVar11 + 1;
    if (iVar2 == 0) break;
    lVar13 = uVar11 + 2;
    piVar9 = piVar9 + 10;
    uVar11 = uVar12;
  } while (lVar13 < _max_global_array);
  uVar12 = -(ulong)(iVar2 != 0) | uVar12;
  if (iVar2 != 0) {
    pnga_error(" Too many process groups ",(long)_max_global_array);
  }
  IVar8 = GAnproc;
  piVar9 = (int *)malloc(GAnproc * 8);
  PGRP_LIST[uVar12].map_proc_list = piVar9;
  __n = IVar8 * 4;
  PGRP_LIST[uVar12].inv_map_proc_list = PGRP_LIST[uVar12].map_proc_list + IVar8;
  if (0 < IVar8) {
    memset(PGRP_LIST[uVar12].map_proc_list,0xff,__n);
    memset(PGRP_LIST[uVar12].inv_map_proc_list,0xff,__n);
  }
  if (grp == -1) {
    if (0 < IVar8) {
      piVar9 = PGRP_LIST[uVar12].map_proc_list;
      piVar3 = PGRP_LIST[uVar12].inv_map_proc_list;
      lVar13 = 0;
      do {
        piVar9[lVar13] = (int)lVar13;
        piVar3[lVar13] = (int)lVar13;
        lVar13 = lVar13 + 1;
      } while (IVar8 != lVar13);
    }
  }
  else if (0 < IVar8) {
    piVar9 = PGRP_LIST[grp].map_proc_list;
    piVar3 = PGRP_LIST[grp].inv_map_proc_list;
    piVar10 = PGRP_LIST[uVar12].map_proc_list;
    piVar4 = PGRP_LIST[uVar12].inv_map_proc_list;
    lVar13 = 0;
    do {
      piVar10[lVar13] = piVar9[lVar13];
      piVar4[lVar13] = piVar3[lVar13];
      lVar13 = lVar13 + 1;
    } while (IVar8 != lVar13);
  }
  ppVar7 = PGRP_LIST;
  piVar9 = &PGRP_LIST[grp].map_nproc;
  iVar2 = *piVar9;
  piVar10 = (int *)malloc(__n);
  iVar6 = GA_Default_Proc_Group;
  auVar5 = _DAT_001b2020;
  piVar3 = *(int **)(piVar9 + 5);
  GA_Default_Proc_Group = piVar9[2];
  if (GA_Default_Proc_Group == -1 || grp == -1) {
    if ((grp == -1) || (GA_Default_Proc_Group != -1)) {
      if (0 < IVar8) {
        lVar13 = IVar8 + -1;
        auVar14._8_4_ = (int)lVar13;
        auVar14._0_8_ = lVar13;
        auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar11 = 0;
        auVar14 = auVar14 ^ _DAT_001b2020;
        auVar15 = _DAT_001b2010;
        do {
          auVar16 = auVar15 ^ auVar5;
          if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                      auVar14._4_4_ < auVar16._4_4_) & 1)) {
            piVar10[uVar11] = (int)uVar11;
          }
          if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
              auVar16._12_4_ <= auVar14._12_4_) {
            piVar10[uVar11 + 1] = (int)uVar11 + 1;
          }
          uVar11 = uVar11 + 2;
          lVar13 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar13 + 2;
        } while ((IVar8 + 1U & 0xfffffffffffffffe) != uVar11);
      }
    }
    else if (0 < iVar2) {
      piVar4 = ppVar7[grp].map_proc_list;
      lVar13 = 0;
      do {
        piVar10[lVar13] = piVar4[piVar3[lVar13]];
        lVar13 = lVar13 + 1;
      } while (iVar2 != lVar13);
    }
  }
  else if (0 < iVar2) {
    piVar4 = ppVar7[GA_Default_Proc_Group].map_proc_list;
    lVar13 = 0;
    do {
      piVar10[lVar13] = piVar4[piVar3[lVar13]];
      lVar13 = lVar13 + 1;
    } while (iVar2 != lVar13);
  }
  ppVar1 = ppVar7 + uVar12;
  ppVar1->map_nproc = iVar2;
  ppVar1->actv = 1;
  ppVar1->parent = ppVar7[grp].parent;
  ppVar1->mirrored = 0;
  ppVar1->map_nproc = *piVar9;
  ARMCI_Group_create(iVar2,piVar10,&ppVar1->group);
  GA_Default_Proc_Group = iVar6;
  free(piVar10);
  return uVar12;
}

Assistant:

Integer pnga_pgroup_duplicate(Integer grp)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    int tmp_count;
    int *tmp_list, *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
    Integer save_grp;
    if (grp != -1 && !PGRP_LIST[grp].actv) {
       pnga_error(" Group is not active ", grp);
    }

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    if (grp != -1) {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = PGRP_LIST[grp].map_proc_list[i];
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = PGRP_LIST[grp].inv_map_proc_list[i];
      }
    } else {
      for (i=0; i<GAnproc; i++) {
        PGRP_LIST[pgrp_handle].map_proc_list[i]
          = i;
        PGRP_LIST[pgrp_handle].inv_map_proc_list[i]
          = i;
      }
    }
    tmp_count = PGRP_LIST[grp].map_nproc;

    tmp_list = (int*)malloc(GAnproc*sizeof(int));
    tmp2_list = PGRP_LIST[grp].inv_map_proc_list;
    save_grp = GA_Default_Proc_Group;
    GA_Default_Proc_Group = PGRP_LIST[grp].parent;
    if (grp != -1 && GA_Default_Proc_Group != -1) {
       int parent = GA_Default_Proc_Group;
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].map_proc_list[tmp2_list[i]];
       }
    } else if (grp != -1 && GA_Default_Proc_Group == -1) {
       for (i=0; i<tmp_count; i++) {
          tmp_list[i] = (int)PGRP_LIST[grp].map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<GAnproc; i++) {
          tmp_list[i] = i;
       }
    }
    
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = PGRP_LIST[grp].parent;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = PGRP_LIST[grp].map_nproc;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp_list, &PGRP_LIST[pgrp_handle].group);
#endif

    GA_Default_Proc_Group = save_grp;
    /* Clean up temporary arrays */
    free(tmp_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}